

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdevexpr.hpp
# Opt level: O0

SPxId __thiscall soplex::SPxDevexPR<double>::selectEnter(SPxDevexPR<double> *this)

{
  long *plVar1;
  bool bVar2;
  Verbosity VVar3;
  long in_RDI;
  Verbosity old_verbosity;
  SPxId enterId;
  char *in_stack_ffffffffffffff68;
  SPxOut *in_stack_ffffffffffffff70;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  undefined1 uVar4;
  SPxSolverBase<double> *in_stack_ffffffffffffff80;
  bool local_71;
  bool local_61;
  bool local_49;
  SPxRowId local_48;
  DataKey in_stack_ffffffffffffffc0;
  SPxDevexPR<double> *in_stack_ffffffffffffffc8;
  undefined4 local_30;
  Verbosity local_2c;
  SPxRowId local_28;
  SPxColId local_20;
  DataKey local_18;
  DataKey local_8;
  
  SPxId::SPxId((SPxId *)0x2df8a9);
  local_18 = (DataKey)selectEnterX(in_stack_ffffffffffffffc8,(double)in_stack_ffffffffffffffc0);
  local_8 = local_18;
  bVar2 = SPxId::isSPxColId((SPxId *)&local_8);
  local_49 = false;
  if (bVar2) {
    SPxColId::SPxColId(&local_20,(SPxId *)&local_8);
    local_49 = SPxSolverBase<double>::isBasic
                         (in_stack_ffffffffffffff80,
                          (SPxColId *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78))
    ;
  }
  if (local_49 != false) {
    local_8 = (DataKey)((ulong)local_8 & 0xffffffff00000000);
  }
  bVar2 = SPxId::isSPxRowId((SPxId *)&local_8);
  local_61 = false;
  if (bVar2) {
    SPxRowId::SPxRowId(&local_28,(SPxId *)&local_8);
    local_61 = SPxSolverBase<double>::isBasic
                         (in_stack_ffffffffffffff80,
                          (SPxRowId *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78))
    ;
  }
  if (local_61 != false) {
    local_8 = (DataKey)((ulong)local_8 & 0xffffffff00000000);
  }
  bVar2 = SPxId::isValid((SPxId *)&local_8);
  if ((!bVar2) && ((*(byte *)(in_RDI + 0xb0) & 1) == 0)) {
    *(undefined1 *)(in_RDI + 0xb0) = 1;
    if ((*(long *)(*(long *)(in_RDI + 0x10) + 0x918) != 0) &&
       (VVar3 = SPxOut::getVerbosity(*(SPxOut **)(*(long *)(in_RDI + 0x10) + 0x918)), 4 < (int)VVar3
       )) {
      local_2c = SPxOut::getVerbosity(*(SPxOut **)(*(long *)(in_RDI + 0x10) + 0x918));
      plVar1 = *(long **)(*(long *)(in_RDI + 0x10) + 0x918);
      local_30 = 5;
      (**(code **)(*plVar1 + 0x10))(plVar1,&local_30);
      soplex::operator<<(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      plVar1 = *(long **)(*(long *)(in_RDI + 0x10) + 0x918);
      (**(code **)(*plVar1 + 0x10))(plVar1,&local_2c);
    }
    local_8 = (DataKey)selectEnterX(in_stack_ffffffffffffffc8,(double)in_stack_ffffffffffffffc0);
    bVar2 = SPxId::isSPxColId((SPxId *)&local_8);
    local_71 = false;
    if (bVar2) {
      in_stack_ffffffffffffff80 = *(SPxSolverBase<double> **)(in_RDI + 0x10);
      SPxColId::SPxColId((SPxColId *)&stack0xffffffffffffffc0,(SPxId *)&local_8);
      local_71 = SPxSolverBase<double>::isBasic
                           (in_stack_ffffffffffffff80,
                            (SPxColId *)
                            CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
    }
    if (local_71 != false) {
      local_8 = (DataKey)((ulong)local_8 & 0xffffffff00000000);
    }
    bVar2 = SPxId::isSPxRowId((SPxId *)&local_8);
    uVar4 = false;
    if (bVar2) {
      SPxRowId::SPxRowId(&local_48,(SPxId *)&local_8);
      uVar4 = SPxSolverBase<double>::isBasic
                        (in_stack_ffffffffffffff80,
                         (SPxRowId *)CONCAT17(uVar4,in_stack_ffffffffffffff78));
    }
    if ((bool)uVar4 != false) {
      local_8 = (DataKey)((ulong)local_8 & 0xffffffff00000000);
    }
  }
  return (SPxId)local_8;
}

Assistant:

SPxId SPxDevexPR<R>::selectEnter()
{
   assert(this->thesolver != nullptr);

   SPxId enterId;

   enterId = selectEnterX(this->thetolerance);

   if(enterId.isSPxColId() && this->thesolver->isBasic(SPxColId(enterId)))
      enterId.info = 0;

   if(enterId.isSPxRowId() && this->thesolver->isBasic(SPxRowId(enterId)))
      enterId.info = 0;

   if(!enterId.isValid() && !refined)
   {
      refined = true;
      SPX_MSG_INFO3((*this->thesolver->spxout),
                    (*this->thesolver->spxout) << "WDEVEX02 trying refinement step..\n";)
      enterId = selectEnterX(this->thetolerance / SOPLEX_DEVEX_REFINETOL);

      if(enterId.isSPxColId() && this->thesolver->isBasic(SPxColId(enterId)))
         enterId.info = 0;

      if(enterId.isSPxRowId() && this->thesolver->isBasic(SPxRowId(enterId)))
         enterId.info = 0;
   }

   return enterId;
}